

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::SwapCoordinates(ON_PolyCurve *this,int i,int j)

{
  ON_Curve *pOVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar2 = (uint)(0 < lVar3);
  lVar4 = 0;
  while ((lVar4 < lVar3 && ((uVar2 & 1) != 0))) {
    pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4];
    uVar2 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1f])
                      (pOVar1,(ulong)(uint)i,(ulong)(uint)j);
    lVar4 = lVar4 + 1;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool
ON_PolyCurve::SwapCoordinates( int i, int j )
{
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->SwapCoordinates( i, j );
  }
	DestroyCurveTree();
  return rc;
}